

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void myell_prog_lawful_city(AREA_DATA_conflict *area,CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  long in_RDX;
  CHAR_DATA *in_RSI;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  
  bVar1 = is_npc(in_stack_ffffffffffffff78);
  if (bVar1) {
    in_stack_ffffffffffffff78 = *(CHAR_DATA **)(in_RDX + 0x188);
    _Var2 = std::pow<int,int>(0,0x6c01e5);
    if (((ulong)in_stack_ffffffffffffff78 & (long)_Var2) == 0) {
      return;
    }
  }
  bVar1 = is_npc(in_stack_ffffffffffffff78);
  if ((!bVar1) && (bVar1 = is_affected(in_RSI,(int)gsn_aggressor), !bVar1)) {
    if ((in_RSI->law_pass & 1U) == 0) {
      init_affect((AFFECT_DATA *)0x6c0247);
      affect_to_char(in_stack_ffffffffffffff80,(AFFECT_DATA *)in_stack_ffffffffffffff78);
    }
    else {
      in_RSI->law_pass = false;
    }
  }
  return;
}

Assistant:

void myell_prog_lawful_city(AREA_DATA *area, CHAR_DATA *ch, CHAR_DATA *victim)
{
	AFFECT_DATA af;

	if ((is_npc(victim) && !IS_SET(victim->act, ACT_LAW))
		|| is_npc(ch)
		|| is_affected(ch, gsn_aggressor))
	{
		return;
	}

	if (ch->law_pass)
	{
		ch->law_pass = false;
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_aggressor;
	af.aftype = AFT_INVIS;
	af.level = 60;
	af.duration = 12;
	affect_to_char(ch, &af);
}